

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

ostream * el::base::debug::operator<<(ostream *ss,StackTraceEntry *si)

{
  byte bVar1;
  ostream *poVar2;
  ulong *in_RSI;
  char *pcVar3;
  ostream *in_RDI;
  
  poVar2 = std::operator<<(in_RDI,"[");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*in_RSI);
  poVar2 = std::operator<<(poVar2,"] ");
  poVar2 = std::operator<<(poVar2,(string *)(in_RSI + 1));
  bVar1 = std::__cxx11::string::empty();
  pcVar3 = ":";
  if ((bVar1 & 1) != 0) {
    pcVar3 = "";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2,(string *)(in_RSI + 5));
  bVar1 = std::__cxx11::string::empty();
  pcVar3 = "+";
  if ((bVar1 & 1) != 0) {
    pcVar3 = "";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2,(string *)(in_RSI + 9));
  std::operator<<(poVar2,(string *)(in_RSI + 0xd));
  return (ostream *)in_RDI;
}

Assistant:

std::ostream& operator<<(std::ostream& ss, const StackTrace::StackTraceEntry& si) {
  ss << "[" << si.m_index << "] " << si.m_location << (si.m_demangled.empty() ? "" : ":") << si.m_demangled
     << (si.m_hex.empty() ? "" : "+") << si.m_hex << si.m_addr;
  return ss;
}